

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateState.cpp
# Opt level: O0

void __thiscall
helics::FederateState::updateDataForTimeReturn
          (FederateState *this,MessageProcessingResult result,Time nextTime,IterationRequest iterate
          )

{
  bool bVar1;
  TimeRepresentation<count_time<9,_long>_> TVar2;
  pointer this_00;
  Time TVar3;
  char in_CL;
  char in_SIL;
  long in_RDI;
  TimeCoordinator *in_stack_ffffffffffffff88;
  TimeRepresentation<count_time<9,_long>_> local_8;
  
  *(int *)(in_RDI + 0x300) = *(int *)(in_RDI + 0x300) + 1;
  if (in_SIL == '\x03') {
    TVar2 = TimeRepresentation<count_time<9,_long>_>::maxVal();
    *(baseType *)(in_RDI + 0x508) = TVar2.internalTimeCode;
    TVar2 = TimeRepresentation<count_time<9,_long>_>::maxVal();
    *(baseType *)(in_RDI + 0x510) = TVar2.internalTimeCode;
    *(undefined1 *)(in_RDI + 0x2fb) = 0;
  }
  else {
    this_00 = std::
              unique_ptr<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>::
              operator->((unique_ptr<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>
                          *)0x4e944e);
    TVar3 = TimeCoordinator::getGrantedTime(this_00);
    *(baseType *)(in_RDI + 0x508) = TVar3.internalTimeCode;
    std::unique_ptr<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>::
    operator->((unique_ptr<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_> *
               )0x4e9475);
    TVar3 = TimeCoordinator::allowedSendTime(in_stack_ffffffffffffff88);
    *(baseType *)(in_RDI + 0x510) = TVar3.internalTimeCode;
    *(bool *)(in_RDI + 0x2fb) = in_SIL == '\x02';
  }
  if (in_CL == '\0') {
    bVar1 = TimeRepresentation<count_time<9,_long>_>::operator<
                      ((TimeRepresentation<count_time<9,_long>_> *)(in_RDI + 0x508),&local_8);
    if ((bVar1) || ((*(byte *)(in_RDI + 0x29c) & 1) != 0)) {
      fillEventVectorInclusive(this,nextTime);
    }
    else {
      fillEventVectorUpTo(this,nextTime);
    }
  }
  else if (in_CL == '\x01') {
    fillEventVectorNextIteration(this,nextTime);
  }
  else if (in_CL == '\x02') {
    bVar1 = TimeRepresentation<count_time<9,_long>_>::operator<
                      ((TimeRepresentation<count_time<9,_long>_> *)(in_RDI + 0x508),&local_8);
    if ((bVar1) || ((*(byte *)(in_RDI + 0x29c) & 1) != 0)) {
      fillEventVectorNextIteration(this,nextTime);
    }
    else {
      fillEventVectorUpTo(this,nextTime);
    }
  }
  return;
}

Assistant:

void FederateState::updateDataForTimeReturn(MessageProcessingResult result,
                                            Time nextTime,
                                            IterationRequest iterate)
{
    ++mGrantCount;
    if (result == MessageProcessingResult::HALTED) {
        time_granted = Time::maxVal();
        allowed_send_time = Time::maxVal();
        iterating = false;
    } else {
        time_granted = timeCoord->getGrantedTime();
        allowed_send_time = timeCoord->allowedSendTime();
        iterating = (result == MessageProcessingResult::ITERATING);
    }

    // now fill the event vector so external systems know what has been updated
    switch (iterate) {
        case IterationRequest::FORCE_ITERATION:
            fillEventVectorNextIteration(time_granted);
            break;
        case IterationRequest::ITERATE_IF_NEEDED:
            if (time_granted < nextTime || wait_for_current_time) {
                fillEventVectorNextIteration(time_granted);
            } else {
                fillEventVectorUpTo(time_granted);
            }
            break;
        case IterationRequest::NO_ITERATIONS:
            if (time_granted < nextTime || wait_for_current_time) {
                fillEventVectorInclusive(time_granted);
            } else {
                fillEventVectorUpTo(time_granted);
            }
            break;
        default:
            break;
    }
}